

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transition.cc
# Opt level: O2

void __thiscall
transition_transition_size_empty_base_optimization_Test::
~transition_transition_size_empty_base_optimization_Test
          (transition_transition_size_empty_base_optimization_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(transition, transition_size_empty_base_optimization) {
    auto transition = make_transition(
        state<s1>,
        event<e1>,
        [](const auto& s, const auto& e) {
            (void)s;
            (void)e;
            return true;
        },
        [](auto& s, auto& e) {
            (void)s;
            (void)e;
            return s2{};
        },
        state<s2>);

    static_assert(sizeof(transition) == 1, "");
}